

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O1

void kj::anon_unknown_6::registerReservedSignal(void)

{
  __sighandler_t p_Var1;
  int *piVar2;
  Fault f;
  Fault local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  registerSignalHandler((anonymous_namespace)::reservedSignal);
  do {
    p_Var1 = signal(0xd,(__sighandler_t)0x1);
    if (p_Var1 != (__sighandler_t)0xffffffffffffffff) {
      return;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_20.exception = (Exception *)0x0;
  local_18 = 0;
  uStack_10 = 0;
  _::Debug::Fault::init
            (&local_20,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
            );
  _::Debug::Fault::fatal(&local_20);
}

Assistant:

void registerReservedSignal() {
  registerSignalHandler(reservedSignal);

  // We also disable SIGPIPE because users of UnixEventPort almost certainly don't want it.
  while (signal(SIGPIPE, SIG_IGN) == SIG_ERR) {
    int error = errno;
    if (error != EINTR) {
      KJ_FAIL_SYSCALL("signal(SIGPIPE, SIG_IGN)", error);
    }
  }
}